

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O3

void __thiscall Rml::DataParser::Emit(DataParser *this,Instruction instruction,Variant *data)

{
  code *pcVar1;
  bool bVar2;
  InstructionData local_50;
  
  if ((((instruction - Assign < 0x2f) &&
       ((0x400000288011U >> ((ulong)(instruction - Assign) & 0x3f) & 1) != 0)) ||
      (instruction == NumArguments)) &&
     (bVar2 = Assert("Use Push(), Pop(), Function(), Variable(), and Assign() procedures for stack manipulation and variable instructions."
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataExpression.cpp"
                     ,0xdf), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  local_50.instruction = instruction;
  Variant::Variant(&local_50.data,data);
  ::std::vector<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>::
  emplace_back<Rml::InstructionData>(&this->program,&local_50);
  Variant::~Variant(&local_50.data);
  return;
}

Assistant:

void Emit(Instruction instruction, Variant data = Variant())
	{
		RMLUI_ASSERTMSG(instruction != Instruction::Push && instruction != Instruction::Pop && instruction != Instruction::NumArguments &&
				instruction != Instruction::TransformFnc && instruction != Instruction::EventFnc && instruction != Instruction::Variable &&
				instruction != Instruction::Assign,
			"Use Push(), Pop(), Function(), Variable(), and Assign() procedures for stack manipulation and variable instructions.");

		program.push_back(InstructionData{instruction, std::move(data)});
	}